

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_leb.c
# Opt level: O0

int dwarf_decode_signed_leb128
              (char *leb128,Dwarf_Unsigned *leb128_length,Dwarf_Signed *outval,char *endptr)

{
  uint uVar1;
  ulong uVar2;
  Dwarf_Signed x_2;
  Dwarf_Signed x_1;
  Dwarf_Signed x;
  Dwarf_Signed y;
  uint local_58;
  uint shiftlim;
  uint byte_length;
  int sign;
  unsigned_long shift;
  Dwarf_Signed number;
  uint b;
  Dwarf_Unsigned byte;
  char *endptr_local;
  Dwarf_Signed *outval_local;
  Dwarf_Unsigned *leb128_length_local;
  char *leb128_local;
  
  shift = 0;
  _byte_length = 0;
  local_58 = 1;
  if ((outval != (Dwarf_Signed *)0x0) && (leb128 < endptr)) {
    uVar1 = (uint)(byte)*leb128;
    leb128_length_local = (Dwarf_Unsigned *)leb128;
    do {
      while( true ) {
        if (_byte_length < 0x40) break;
        if ((uVar1 == 0) || (uVar1 == 0x40)) {
LAB_002f005c:
          if ((uVar1 & 0x40) != 0) {
            if (_byte_length < 0x3f) {
              uVar2 = -(1L << ((byte)_byte_length & 0x3f));
            }
            else if (_byte_length == 0x3f) {
              uVar2 = 1L << ((byte)_byte_length & 0x3f);
            }
            else {
              uVar2 = 0x8000000000000000;
            }
            shift = uVar2 | shift;
          }
          if (leb128_length != (Dwarf_Unsigned *)0x0) {
            *leb128_length = (ulong)local_58;
          }
          *outval = shift;
          return 0;
        }
        if ((uVar1 & 0x7f) != 0) {
          return 1;
        }
        local_58 = local_58 + 1;
        if (0x18 < local_58) {
          if (leb128_length != (Dwarf_Unsigned *)0x0) {
            *leb128_length = 0x18;
          }
          return 1;
        }
        leb128_length_local = (Dwarf_Unsigned *)((long)leb128_length_local + 1);
        _byte_length = _byte_length + 7;
        if (endptr <= leb128_length_local) {
          return 1;
        }
        uVar1 = (uint)*(byte *)leb128_length_local;
      }
      shift = (ulong)(uVar1 & 0x7f) << ((byte)_byte_length & 0x3f) | shift;
      _byte_length = _byte_length + 7;
      if ((uVar1 & 0x80) == 0) goto LAB_002f005c;
      leb128_length_local = (Dwarf_Unsigned *)((long)leb128_length_local + 1);
      if (endptr <= leb128_length_local) {
        return 1;
      }
      uVar1 = (uint)*(byte *)leb128_length_local;
      local_58 = local_58 + 1;
    } while (local_58 < 0x19);
    if (leb128_length != (Dwarf_Unsigned *)0x0) {
      *leb128_length = 0x18;
    }
  }
  return 1;
}

Assistant:

int
dwarf_decode_signed_leb128(char * leb128,
    Dwarf_Unsigned * leb128_length,
    Dwarf_Signed *outval,char * endptr)
{
    Dwarf_Unsigned byte   = 0;
    unsigned int   b      = 0;
    Dwarf_Signed   number = 0;
    unsigned long  shift  = 0;
    int            sign   = FALSE;
    /*  The byte_length value will be a small non-negative integer. */
    unsigned int   byte_length = 1;

    /*  byte_length being the number of bytes
        of data absorbed so far in
        turning the leb into a Dwarf_Signed. */
    if (!outval) {
        return DW_DLV_ERROR;
    }
    if (leb128 >= endptr) {
        return DW_DLV_ERROR;
    }
    byte   = *(unsigned char *)leb128;
    for (;;) {
        b = byte & 0x7f;
        if (shift >= (sizeof(number)*BITSPERBYTE)) {
            /*  Shift is large. Maybe corrupt value,
                maybe some padding high-end byte zeroes
                that we can ignore (but notice sign bit
                from the last usable byte). */
            sign =  b & 0x40;
            if (!byte || byte == 0x40) {
                /*  The value is complete. */
                break;
            }
            if (b == 0) {
                ++byte_length;
                if (byte_length > BYTESLEBMAX) {
                    /*  Erroneous input.  */
                    if (leb128_length) {
                        *leb128_length = BYTESLEBMAX;
                    }
                    return DW_DLV_ERROR;
                }
                ++leb128;
                /*  shift cannot overflow as
                    BYTESLEBMAX is not a large value */
                shift += 7;
                if (leb128 >= endptr) {
                    return DW_DLV_ERROR;
                }
                byte = *(unsigned char *)leb128;
                continue;
            }
            /*  Too big, corrupt data given the non-zero
                byte content */
            return DW_DLV_ERROR;
        }
        /*  This bit of the last byte indicates sign */
        sign =  b & 0x40;
        number |= ((Dwarf_Unsigned)b) << shift;
        shift += 7;
        if ((byte & 0x80) == 0) {
            break;
        }
        ++leb128;
        if (leb128 >= endptr) {
            return DW_DLV_ERROR;
        }
        byte = *(unsigned char *)leb128;
        byte_length++;
        if (byte_length > BYTESLEBMAX) {
            /*  Erroneous input. */
            if (leb128_length) {
                *leb128_length = BYTESLEBMAX;
            }
            return DW_DLV_ERROR;
        }
    }
    if (sign) {
        /* The following avoids undefined behavior. */
        unsigned int shiftlim = sizeof(Dwarf_Signed) * BITSPERBYTE -1;
        if (shift < shiftlim) {
            Dwarf_Signed y = (Dwarf_Signed)
                (((Dwarf_Unsigned)1) << shift);
            Dwarf_Signed x = -y;
            number |= x;
        } else if (shift == shiftlim) {
            Dwarf_Signed x= (((Dwarf_Unsigned)1) << shift);
            number |= x;
        } else {
            /* trailing zeroes case */
            Dwarf_Signed x= (((Dwarf_Unsigned)1) << shiftlim);
            number |= x;
        }
    }
    if (leb128_length) {
        *leb128_length = byte_length;
    }
    *outval = number;
    return DW_DLV_OK;
}